

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brightness_ctrl.cpp
# Opt level: O3

void __thiscall BrightnessControl::_brightness_slide(BrightnessControl *this,int p)

{
  double dVar1;
  double dVar2;
  uint v;
  int iVar3;
  int *piVar4;
  int iVar5;
  undefined4 uVar6;
  undefined1 local_68 [16];
  timespec local_40;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->adjust_m);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  iVar5 = p + this->offset;
  iVar3 = 100;
  if (iVar5 < 100) {
    iVar3 = iVar5;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  v = (iVar3 * this->maxbr) / 100;
  if ((int)v <= this->minabr) {
    v = this->minabr;
  }
  fprintf(_stderr,"%c: brightness adjust: %d->%d/%d\n",0x49,(ulong)(uint)this->br,(ulong)v);
  iVar3 = this->br;
  local_68 = ZEXT816(0x3ff0000000000000);
  do {
    iVar5 = this->br;
    dVar1 = (double)iVar5;
    if ((int)v < iVar3) {
      dVar2 = round(-(double)local_68._0_8_);
      if (dVar2 + dVar1 < (double)(int)v) goto LAB_00109ee8;
    }
    else {
      dVar2 = round((double)local_68._0_8_);
      if ((double)(int)v < dVar2 + dVar1) {
LAB_00109ee8:
        this->br = v;
        writeint((this->brpath)._M_pathname._M_dataplus._M_p,v);
        pthread_mutex_unlock((pthread_mutex_t *)&this->adjust_m);
        return;
      }
    }
    dVar1 = round((double)local_68._0_8_ * (double)(int)((uint)(iVar3 <= (int)v) * 2 + -1));
    iVar5 = iVar5 + (int)dVar1;
    this->br = iVar5;
    writeint((this->brpath)._M_pathname._M_dataplus._M_p,iVar5);
    local_40.tv_sec = 0;
    local_40.tv_nsec = 10000000;
    do {
      iVar5 = nanosleep(&local_40,&local_40);
      if (iVar5 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    uVar6 = local_68._12_4_;
    local_68._8_4_ = local_68._8_4_;
    local_68._0_8_ = (double)local_68._0_8_ * 1.2;
    local_68._12_4_ = uVar6;
  } while( true );
}

Assistant:

void BrightnessControl::_brightness_slide(int p)
{
	std::lock_guard<std::mutex> adjust_lck(adjust_m);
	p+=offset;
	if(p>100)p=100;
	if(p<0)p=0;
	int pbr=maxbr*p/100;
	if(pbr<minabr)pbr=minabr;
	LOG('I',"brightness adjust: %d->%d/%d",br,pbr,maxbr);
	int d=1;if(pbr<br)d=-1;double dd=1;
	while(d>0&&br+round(d*dd)<=pbr||d<0&&br+round(d*dd)>=pbr)
	{
		br+=(int)round(d*dd);writeint(brpath.c_str(),br);
		dd=dd*1.2;std::this_thread::sleep_for(std::chrono::milliseconds(10));
	}
	br=pbr;writeint(brpath.c_str(),br);
}